

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::ParseDecl(Parser *this,char *filename)

{
  SymbolTable<flatbuffers::Value> *this_00;
  _Rb_tree_header *p_Var1;
  FieldDef *pFVar2;
  pointer pcVar3;
  undefined8 struct_def_00;
  int iVar4;
  const_iterator cVar5;
  ulong uVar6;
  pointer ppFVar7;
  Type *e;
  long *plVar8;
  size_type *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  char *in_RDX;
  FieldDef *pFVar11;
  undefined8 extraout_RDX;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  __last;
  StructDef *pSVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar17;
  string qualified_name;
  voffset_t id;
  StructDef *struct_def;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dc;
  string local_158;
  unsigned_short local_132;
  string local_130;
  FieldDef *local_110;
  StructDef *local_108;
  StructDef *local_100 [2];
  undefined1 local_f0 [80];
  pointer local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(filename + 0x48));
  if (*(int *)(filename + 0x1c) == 0x104) {
    iVar4 = std::__cxx11::string::compare(filename + 0x28);
    bVar15 = iVar4 == 0;
  }
  else {
    bVar15 = false;
  }
  if ((bVar15 == false) &&
     ((*(int *)(filename + 0x1c) != 0x104 ||
      (iVar4 = std::__cxx11::string::compare(filename + 0x28), iVar4 != 0)))) {
    local_100[0] = (StructDef *)local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"declaration expected","");
    Error(this,(string *)filename);
    if (local_100[0] == (StructDef *)local_f0) goto LAB_00118813;
  }
  else {
    Next(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00118813;
    local_100[0] = (StructDef *)local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,*(long *)(filename + 0x28),
               *(long *)(filename + 0x30) + *(long *)(filename + 0x28));
    iVar4 = (int)filename;
    Expect(this,iVar4);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      StartStruct(this,(string *)filename,local_100);
      pSVar12 = local_108;
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&(local_108->super_Definition).doc_comment,&local_48);
        pSVar12->fixed = bVar15;
        if ((in_RDX != (char *)0x0) && (*(long *)(filename + 0x628) != 0)) {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          strlen(in_RDX);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130);
          FilePath(&local_158,(string *)(filename + 0x620),&local_130,(bool)filename[0x4e4]);
          pVar17 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)(filename + 0x748),&local_158);
          (pSVar12->super_Definition).declaration_file =
               (string *)(pVar17.first._M_node._M_node + 1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
        }
        this_00 = &(pSVar12->super_Definition).attributes;
        ParseMetaData(this,(SymbolTable<flatbuffers::Value> *)filename);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"original_order","");
          cVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                          *)this_00,&local_158);
          p_Var1 = &(pSVar12->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
            bVar16 = true;
          }
          else {
            bVar16 = *(long *)(cVar5._M_node + 2) == 0;
          }
          pSVar12->sortbysize = (bool)((bVar15 ^ 1U) & bVar16);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          Expect(this,iVar4);
LAB_001188ad:
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00118798;
          if (*(int *)(filename + 0x1c) != 0x7d) goto LAB_001188c1;
          if (bVar15 != false) {
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"force_align","");
            cVar5 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                            *)this_00,&local_158);
            if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
              lVar13 = 0;
            }
            else {
              lVar13 = *(long *)(cVar5._M_node + 2);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if (lVar13 != 0) {
              ParseAlignAttribute(this,(string *)filename,lVar13 + 0x20,(size_t *)pSVar12->minalign)
              ;
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00118798;
              local_108->minalign = (size_t)local_158._M_dataplus._M_p;
            }
            if (local_108->bytesize == 0) {
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_158,"size 0 structs not allowed","");
              Error(this,(string *)filename);
              goto LAB_00118e5e;
            }
          }
          uVar6 = local_108->minalign - 1 & -local_108->bytesize;
          local_108->bytesize = local_108->bytesize + uVar6;
          pFVar11 = (FieldDef *)
                    (local_108->fields).vec.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pFVar2 = (FieldDef *)
                   (local_108->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pFVar2 != pFVar11) {
            (pFVar2[-1].sibling_union_field)->padding = uVar6;
          }
          local_f0._24_8_ = &(local_108->fields).vec;
          if ((bVar15 != false) ||
             ((FieldDef *)
              (local_108->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish == pFVar11)) goto LAB_00118c07;
          __last._M_current =
               (local_108->fields).vec.
               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          lVar13 = 0;
          pSVar12 = local_108;
          if (pFVar11 != (FieldDef *)__last._M_current) {
            local_f0._64_8_ = local_108;
            do {
              pcVar3 = (pFVar11->super_Definition).name._M_dataplus._M_p;
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              local_110 = pFVar11;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"id","");
              cVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                              *)(pcVar3 + 0x58),&local_158);
              if (cVar5._M_node == (_Base_ptr)(pcVar3 + 0x60)) {
                uVar6 = 0;
              }
              else {
                uVar6 = (ulong)(*(long *)(cVar5._M_node + 2) != 0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
              }
              lVar13 = lVar13 + uVar6;
              pFVar11 = (FieldDef *)&(local_110->super_Definition).name._M_string_length;
              __last._M_current =
                   (((SymbolTable<flatbuffers::FieldDef> *)(local_f0._64_8_ + 200))->vec).
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              pSVar12 = (StructDef *)local_f0._64_8_;
            } while (pFVar11 != (FieldDef *)__last._M_current);
          }
          if ((lVar13 == 0) && (filename[0x67c] != '\x01')) {
LAB_00118c07:
            struct_def_00 = local_f0._24_8_;
            CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                             *)filename,(StructDef *)local_f0._24_8_,(char *)local_108,0x154eac);
            *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
            if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
              CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                               *)filename,(StructDef *)struct_def_00,(char *)local_108,0x154101);
              *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
              if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                 *)filename,(StructDef *)struct_def_00,(char *)local_108,0x154106);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                  CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                   *)filename,(StructDef *)struct_def_00,(char *)local_108,0x1560a0)
                  ;
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                    CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                     *)filename,(StructDef *)struct_def_00,(char *)local_108,
                               0x15410e);
                    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                      CheckClash(this,(vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                       *)filename,(StructDef *)struct_def_00,(char *)local_108,
                                 0x15411b);
                      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                      if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                        Expect(this,iVar4);
                        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                        if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
                          Namespace::GetFullyQualifiedName
                                    (&local_158,*(Namespace **)(filename + 0x198),
                                     (string *)local_108,1000);
                          e = (Type *)operator_new(0x20);
                          e->base_type = BASE_TYPE_STRUCT;
                          e->element = BASE_TYPE_NONE;
                          e->struct_def = local_108;
                          e->enum_def = (EnumDef *)0x0;
                          e->fixed_length = 0;
                          bVar15 = SymbolTable<flatbuffers::Type>::Add
                                             ((SymbolTable<flatbuffers::Type> *)(filename + 0x60),
                                              &local_158,e);
                          if (bVar15) {
                            std::operator+(&local_130,"datatype already exists: ",&local_158);
                            Error(this,(string *)filename);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
                              operator_delete(local_130._M_dataplus._M_p,
                                              local_130.field_2._M_allocated_capacity + 1);
                            }
                          }
                          else {
                            *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
                          }
                          goto LAB_00118e5e;
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_00118798;
          }
          if (lVar13 == (long)__last._M_current - (long)*(FieldDef ***)local_f0._24_8_ >> 3) {
            std::
            sort<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef**,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,bool(*)(flatbuffers::FieldDef_const*,flatbuffers::FieldDef_const*)>
                      ((__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        )*(FieldDef ***)local_f0._24_8_,__last,anon_unknown_0::compareFieldDefs);
            if (0x7fff8 < (ulong)((long)(pSVar12->fields).vec.
                                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pSVar12->fields).vec.
                                       super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start)) {
              __assert_fail("fields.size() <= flatbuffers::numeric_limits<voffset_t>::max()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                            ,0xaf8,"CheckedError flatbuffers::Parser::ParseDecl(const char *)");
            }
            ppFVar7 = (pSVar12->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((*(int *)&(pSVar12->fields).vec.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (int)ppFVar7 & 0x7fff8U) == 0
               ) goto LAB_00118c07;
            uVar6 = CONCAT62((int6)((ulong)extraout_RDX >> 0x10),4);
            uVar14 = 0;
            while( true ) {
              local_f0._20_4_ = (undefined4)uVar6;
              pFVar11 = ppFVar7[uVar14];
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"id","");
              cVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                              *)&(pFVar11->super_Definition).attributes,&local_158);
              if (cVar5._M_node ==
                  (_Base_ptr)((long)&(pFVar11->super_Definition).attributes.dict + 8U)) {
                lVar13 = 0;
              }
              else {
                lVar13 = *(long *)(cVar5._M_node + 2);
              }
              local_110 = pFVar11;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                operator_delete(local_158._M_dataplus._M_p,
                                local_158.field_2._M_allocated_capacity + 1);
              }
              __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (lVar13 + 0x20);
              local_132 = 0;
              anon_unknown_0::atot<unsigned_short>
                        ((anon_unknown_0 *)&local_158,(__rhs->_M_dataplus)._M_p,(Parser *)filename,
                         &local_132);
              if ((char)local_158._M_dataplus._M_p == '\x01') {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_f0 + 0x20),"field id\'s must be non-negative number, field: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_110);
                plVar8 = (long *)std::__cxx11::string::append(local_f0 + 0x20);
                psVar9 = (size_type *)(plVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar9) {
                  local_130.field_2._M_allocated_capacity = *psVar9;
                  local_130.field_2._8_8_ = plVar8[3];
                  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                }
                else {
                  local_130.field_2._M_allocated_capacity = *psVar9;
                  local_130._M_dataplus._M_p = (pointer)*plVar8;
                }
                local_130._M_string_length = plVar8[1];
                *plVar8 = (long)psVar9;
                plVar8[1] = 0;
                *(undefined1 *)(plVar8 + 2) = 0;
                std::operator+(&local_158,&local_130,__rhs);
                Error(this,(string *)filename);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_158._M_dataplus._M_p != &local_158.field_2) {
                  operator_delete(local_158._M_dataplus._M_p,
                                  local_158.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  operator_delete(local_130._M_dataplus._M_p,
                                  local_130.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._32_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_f0 + 0x30)) goto LAB_00118e75;
                goto LAB_00118798;
              }
              if (uVar14 != local_132) break;
              if (uVar14 == 0x7ffe) {
                __assert_fail("offset < std::numeric_limits<voffset_t>::max()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flatbuffer_builder.h"
                              ,0x31,"voffset_t flatbuffers::FieldIndexToOffset(voffset_t)");
              }
              (local_110->value).offset = (voffset_t)local_f0._20_4_;
              uVar14 = uVar14 + 1;
              ppFVar7 = (pSVar12->fields).vec.
                        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar6 = (ulong)(local_f0._20_4_ + 2);
              if (((uint)(*(int *)&(pSVar12->fields).vec.
                                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (int)ppFVar7) >> 3 &
                  0xffff) <= (uint)uVar14) goto LAB_00118c07;
            }
            NumToString<unsigned_short>((string *)&local_88,(unsigned_short)uVar14);
            std::operator+(&local_68,"field id\'s must be consecutive from 0, id ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_88);
            pFVar11 = local_110;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_68);
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 == paVar10) {
              local_98._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_98._8_8_ = plVar8[3];
              local_f0._72_8_ = &local_98;
            }
            else {
              local_98._M_allocated_capacity = paVar10->_M_allocated_capacity;
              local_f0._72_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar8;
            }
            local_a0 = (pointer)plVar8[1];
            *plVar8 = (long)paVar10;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_f0 + 0x20),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_f0 + 0x48),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pFVar11);
            plVar8 = (long *)std::__cxx11::string::append(local_f0 + 0x20);
            psVar9 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_130.field_2._M_allocated_capacity = *psVar9;
              local_130.field_2._8_8_ = plVar8[3];
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            }
            else {
              local_130.field_2._M_allocated_capacity = *psVar9;
              local_130._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_130._M_string_length = plVar8[1];
            *plVar8 = (long)psVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::operator+(&local_158,&local_130,__rhs);
            Error(this,(string *)filename);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
              operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._32_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_f0 + 0x30)) {
              operator_delete((void *)local_f0._32_8_,local_f0._48_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._72_8_ != &local_98) {
              operator_delete((void *)local_f0._72_8_,local_98._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            local_f0._48_8_ = local_78._M_allocated_capacity;
            local_f0._32_8_ = local_88._M_allocated_capacity;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_allocated_capacity != &local_78) goto LAB_00118e75;
          }
          else {
            if (filename[0x67c] == '\x01') {
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_158,
                         "all fields must have an \'id\' attribute when --require-explicit-ids is used"
                         ,"");
              Error(this,(string *)filename);
            }
            else {
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_158,
                         "either all fields or no fields must have an \'id\' attribute","");
              Error(this,(string *)filename);
            }
LAB_00118e5e:
            local_f0._48_8_ = local_158.field_2._M_allocated_capacity;
            local_f0._32_8_ = local_158._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
LAB_00118e75:
              operator_delete((void *)local_f0._32_8_,
                              (ulong)((long)&((_Base_ptr)local_f0._48_8_)->_M_color + 1));
            }
          }
        }
      }
    }
LAB_00118798:
    if (local_100[0] == (StructDef *)local_f0) goto LAB_00118813;
  }
  operator_delete(local_100[0],(ulong)(local_f0._0_8_ + 1));
LAB_00118813:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return SUB82(this,0);
LAB_001188c1:
  ParseField(this,(StructDef *)filename);
  goto LAB_001188ad;
}

Assistant:

CheckedError Parser::ParseDecl(const char *filename) {
  std::vector<std::string> dc = doc_comment_;
  bool fixed = IsIdent("struct");
  if (!fixed && !IsIdent("table")) return Error("declaration expected");
  NEXT();
  std::string name = attribute_;
  EXPECT(kTokenIdentifier);
  StructDef *struct_def;
  ECHECK(StartStruct(name, &struct_def));
  struct_def->doc_comment = dc;
  struct_def->fixed = fixed;
  if (filename && !opts.project_root.empty()) {
    struct_def->declaration_file =
        &GetPooledString(FilePath(opts.project_root, filename, opts.binary_schema_absolute_paths));
  }
  ECHECK(ParseMetaData(&struct_def->attributes));
  struct_def->sortbysize =
      struct_def->attributes.Lookup("original_order") == nullptr && !fixed;
  EXPECT('{');
  while (token_ != '}') ECHECK(ParseField(*struct_def));
  if (fixed) {
    const auto force_align = struct_def->attributes.Lookup("force_align");
    if (force_align) {
      size_t align;
      ECHECK(ParseAlignAttribute(force_align->constant, struct_def->minalign,
                                 &align));
      struct_def->minalign = align;
    }
    if (!struct_def->bytesize) return Error("size 0 structs not allowed");
  }
  struct_def->PadLastField(struct_def->minalign);
  // Check if this is a table that has manual id assignments
  auto &fields = struct_def->fields.vec;
  if (!fixed && fields.size()) {
    size_t num_id_fields = 0;
    for (auto it = fields.begin(); it != fields.end(); ++it) {
      if ((*it)->attributes.Lookup("id")) num_id_fields++;
    }
    // If any fields have ids..
    if (num_id_fields || opts.require_explicit_ids) {
      // Then all fields must have them.
      if (num_id_fields != fields.size()) {
        if (opts.require_explicit_ids) {
          return Error(
              "all fields must have an 'id' attribute when "
              "--require-explicit-ids is used");
        } else {
          return Error(
              "either all fields or no fields must have an 'id' attribute");
        }
      }
      // Simply sort by id, then the fields are the same as if no ids had
      // been specified.
      std::sort(fields.begin(), fields.end(), compareFieldDefs);
      // Verify we have a contiguous set, and reassign vtable offsets.
      FLATBUFFERS_ASSERT(fields.size() <=
                         flatbuffers::numeric_limits<voffset_t>::max());
      for (voffset_t i = 0; i < static_cast<voffset_t>(fields.size()); i++) {
        auto &field = *fields[i];
        const auto &id_str = field.attributes.Lookup("id")->constant;

        // Metadata values have a dynamic type, they can be `float`, 'int', or
        // 'string`.
        // The FieldIndexToOffset(i) expects the voffset_t so `id` is limited by
        // this type.
        voffset_t id = 0;
        const auto done = !atot(id_str.c_str(), *this, &id).Check();
        if (!done)
          return Error("field id\'s must be non-negative number, field: " +
                       field.name + ", id: " + id_str);
        if (i != id)
          return Error("field id\'s must be consecutive from 0, id " +
                       NumToString(i) + " missing or set twice, field: " +
                       field.name + ", id: " + id_str);
        field.value.offset = FieldIndexToOffset(i);
      }
    }
  }

  ECHECK(
      CheckClash(fields, struct_def, UnionTypeFieldSuffix(), BASE_TYPE_UNION));
  ECHECK(CheckClash(fields, struct_def, "Type", BASE_TYPE_UNION));
  ECHECK(CheckClash(fields, struct_def, "_length", BASE_TYPE_VECTOR));
  ECHECK(CheckClash(fields, struct_def, "Length", BASE_TYPE_VECTOR));
  ECHECK(CheckClash(fields, struct_def, "_byte_vector", BASE_TYPE_STRING));
  ECHECK(CheckClash(fields, struct_def, "ByteVector", BASE_TYPE_STRING));
  EXPECT('}');
  const auto qualified_name =
      current_namespace_->GetFullyQualifiedName(struct_def->name);
  if (types_.Add(qualified_name,
                 new Type(BASE_TYPE_STRUCT, struct_def, nullptr)))
    return Error("datatype already exists: " + qualified_name);
  return NoError();
}